

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O1

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          (InputArchive<cereal::PortableBinaryInputArchive,1u> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,int *tail_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_2)

{
  long lVar1;
  size_type size;
  size_t local_40;
  int *local_38;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 8);
  local_38 = tail_1;
  PortableBinaryInputArchive::loadBinary<8ul>
            (*(PortableBinaryInputArchive **)
              (*(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8) + 8),&local_40,8);
  std::__cxx11::string::resize((ulong)head,(char)local_40);
  PortableBinaryInputArchive::loadBinary<1ul>
            (*(PortableBinaryInputArchive **)(*(long *)(lVar1 + 8) + 8),(head->_M_dataplus)._M_p,
             local_40);
  lVar1 = *(long *)(*(long *)(this + 8) + 8);
  PortableBinaryInputArchive::loadBinary<8ul>
            (*(PortableBinaryInputArchive **)
              (*(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8) + 8),&local_40,8);
  std::__cxx11::string::resize((ulong)tail,(char)local_40);
  PortableBinaryInputArchive::loadBinary<1ul>
            (*(PortableBinaryInputArchive **)(*(long *)(lVar1 + 8) + 8),(tail->_M_dataplus)._M_p,
             local_40);
  PortableBinaryInputArchive::loadBinary<4ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),local_38,4);
  lVar1 = *(long *)(*(long *)(this + 8) + 8);
  PortableBinaryInputArchive::loadBinary<8ul>
            (*(PortableBinaryInputArchive **)
              (*(long *)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8) + 8),&local_40,8);
  std::__cxx11::string::resize((ulong)tail_2,(char)local_40);
  PortableBinaryInputArchive::loadBinary<1ul>
            (*(PortableBinaryInputArchive **)(*(long *)(lVar1 + 8) + 8),(tail_2->_M_dataplus)._M_p,
             local_40);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }